

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::Connection::send_from_queue(Connection *this)

{
  element_type *peVar1;
  type s;
  pointer this_00;
  element_type *peVar2;
  anon_class_16_1_89917c4a_for_handler_ local_48;
  _List_iterator<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection::OutData>
  local_38 [3];
  undefined1 local_20 [8];
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  self;
  Connection *this_local;
  
  self.
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::
  enable_shared_from_this<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::shared_from_this((enable_shared_from_this<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                      *)local_20);
  set_timeout(this,-1);
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  s = std::
      unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
      ::operator*(&peVar1->socket);
  local_38[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection::OutData,_std::allocator<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection::OutData>_>
       ::begin(&this->send_queue);
  this_00 = std::
            _List_iterator<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection::OutData>
            ::operator->(local_38);
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::OutMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::OutMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::shared_ptr(&local_48.self,
               (shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                *)local_20);
  asio::
  async_write<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>,std::allocator<char>,SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection::send_from_queue()::_lambda(std::error_code_const&,unsigned_long)_1_>
            (s,&peVar2->streambuf,&local_48);
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
  ::Connection::send_from_queue()::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_std__error_code_const__unsigned_long__1_ *)&local_48);
  std::
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::~shared_ptr((shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                 *)local_20);
  return;
}

Assistant:

REQUIRES(send_queue_mutex) {
        auto self = this->shared_from_this();
        set_timeout();
        asio::async_write(*self->socket, send_queue.begin()->out_message->streambuf, [self](const error_code &ec, std::size_t /*bytes_transferred*/) {
          self->set_timeout(); // Set timeout for next send
          auto lock = self->handler_runner->continue_lock();
          if(!lock)
            return;
          {
            LockGuard lock(self->send_queue_mutex);
            if(!ec) {
              auto it = self->send_queue.begin();
              auto callback = std::move(it->callback);
              self->send_queue.erase(it);
              if(self->send_queue.size() > 0)
                self->send_from_queue();

              lock.unlock();
              if(callback)
                callback(ec);
            }
            else {
              // All handlers in the queue is called with ec:
              std::vector<std::function<void(const error_code &)>> callbacks;
              for(auto &out_data : self->send_queue) {
                if(out_data.callback)
                  callbacks.emplace_back(std::move(out_data.callback));
              }
              self->send_queue.clear();

              lock.unlock();
              for(auto &callback : callbacks)
                callback(ec);
            }
          }
        });
      }